

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mttc0_tchalt_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  uint uVar1;
  ulong uVar2;
  TCState *pTVar3;
  target_ulong_conflict tVar4;
  CPUState *cpu;
  CPUState *cpu_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = env->CP0_VPEConf0;
  if (((uVar1 & 2) == 0) ||
     (uVar2 = (long)(ulong)(byte)env->CP0_VPEControl %
              (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c), (uint32_t)uVar2 == env->current_tc)
     ) {
    pTVar3 = &env->active_tc;
  }
  else {
    pTVar3 = env->tcs + (uVar2 & 0xffffffff);
  }
  cpu_00 = (CPUState *)(env[-4].tcs[0xd].mmr + 5);
  pTVar3->CP0_TCHalt = arg1;
  bVar6 = (uVar1 & 1) == 0;
  bVar5 = ((uint)(env->active_tc).CP0_TCStatus >> 0xd & 1) == 0;
  bVar7 = (env->mvp->CP0_MVPControl & 1U) == 0;
  tVar4 = (env->active_tc).CP0_TCHalt;
  if ((arg1 & 1) == 0) {
    if ((((!bVar5 && !bVar6) && (tVar4 & 1) == 0) && !bVar7) && (env[-1].tcs[0xc].gpr[4] == 0)) {
      (*cpu_interrupt_handler)(cpu_00,0x100);
      return;
    }
  }
  else if (((bVar5 || bVar6) || (tVar4 & 1) != 0) || bVar7) {
    env[-1].tcs[0xc].gpr[4] = 1;
    cpu_reset_interrupt(cpu_00,0x100);
    return;
  }
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}